

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStructTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ShaderStructCase::init(ShaderStructCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Texture2D *tex2D;
  Sampler local_a8;
  TextureBinding local_60;
  
  if (this->m_usesTexture == true) {
    tex2D = glu::Texture2D::create
                      ((this->super_ShaderRenderCase).m_renderCtx,
                       (this->super_ShaderRenderCase).m_ctxInfo,
                       ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx)->
                       m_curArchive,"data/brick.png");
    this->m_brickTexture = tex2D;
    local_a8.wrapS = CLAMP_TO_EDGE;
    local_a8.wrapT = CLAMP_TO_EDGE;
    local_a8.wrapR = CLAMP_TO_EDGE;
    local_a8.minFilter = LINEAR;
    local_a8.magFilter = LINEAR;
    local_a8.lodThreshold = 0.0;
    local_a8.normalizedCoords = true;
    local_a8.depthStencilMode = MODE_DEPTH;
    local_a8.compare = COMPAREMODE_NONE;
    local_a8.compareChannel = 0;
    local_a8.borderColor.v.uData[0]._0_1_ = 0;
    local_a8.borderColor.v._1_7_ = 0;
    local_a8.borderColor.v.uData[2]._0_1_ = 0;
    local_a8._45_8_ = 0;
    ctx = (EVP_PKEY_CTX *)&local_60;
    deqp::gls::TextureBinding::TextureBinding((TextureBinding *)ctx,tex2D,&local_a8);
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
    emplace_back<deqp::gls::TextureBinding>
              (&(this->super_ShaderRenderCase).m_textures,(TextureBinding *)ctx);
  }
  iVar1 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  return iVar1;
}

Assistant:

void ShaderStructCase::init (void)
{
	if (m_usesTexture)
	{
		m_brickTexture = glu::Texture2D::create(m_renderCtx, m_ctxInfo, m_testCtx.getArchive(), "data/brick.png");
		m_textures.push_back(TextureBinding(m_brickTexture, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
																		 tcu::Sampler::LINEAR, tcu::Sampler::LINEAR)));
		DE_ASSERT(m_textures.size() == 1);
	}
	gls::ShaderRenderCase::init();
}